

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<11,_8,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  Matrix<float,_2,_3> *extraout_RDX;
  Matrix<float,_2,_3> *extraout_RDX_00;
  Matrix<float,_2,_3> *mat;
  Matrix<float,_2,_3> *mat_00;
  Type in0;
  Mat3x2 MStack_b8;
  Vector<float,_3> local_a0;
  Vector<float,_3> local_90;
  tcu local_84 [12];
  Matrix<float,_2,_3> local_78;
  Matrix<float,_2,_3> local_58;
  VecAccess<float,_4,_3> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,8>
              (&MStack_b8,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    mat = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_2,_3>::Matrix(&MStack_b8,(float *)sr::(anonymous_namespace)::s_constInMat3x2)
    ;
    mat = extraout_RDX_00;
  }
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,2,3>
            (&local_58,(MatrixCaseUtils *)&MStack_b8,mat);
  local_90.m_data[2] = local_58.m_data.m_data[2].m_data[0] + local_58.m_data.m_data[2].m_data[1];
  local_90.m_data[1] = local_58.m_data.m_data[1].m_data[1] + local_58.m_data.m_data[1].m_data[0];
  local_90.m_data[0] = local_58.m_data.m_data[0].m_data[0] + local_58.m_data.m_data[0].m_data[1];
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,2,3>
            (&local_78,(MatrixCaseUtils *)&MStack_b8,mat_00);
  local_a0.m_data[2] = local_78.m_data.m_data[2].m_data[0] + local_78.m_data.m_data[2].m_data[1];
  local_a0.m_data[1] = local_78.m_data.m_data[1].m_data[1] + local_78.m_data.m_data[1].m_data[0];
  local_a0.m_data[0] = local_78.m_data.m_data[0].m_data[0] + local_78.m_data.m_data[0].m_data[1];
  tcu::operator+(local_84,&local_90,&local_a0);
  local_38.m_vector = &evalCtx->color;
  local_38.m_index[0] = 0;
  local_38.m_index[1] = 1;
  local_38.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,(Vector<float,_3> *)local_84);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(in0)) + reduceToVec3(increment(in0));
	}